

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

void __thiscall
gl4cts::CopyImage::IncompleteTexTest::IncompleteTexTest(IncompleteTexTest *this,Context *context)

{
  vector<gl4cts::CopyImage::IncompleteTexTest::testCase,_std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>_>
  *this_00;
  pointer *pptVar1;
  iterator iVar2;
  uint6 uVar3;
  long lVar4;
  testCase test_case;
  testCase local_34;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"incomplete_tex",
             "Test verifies if INVALID_OPERATION is generated when texture provided to CopySubImageData is incomplete"
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__IncompleteTexTest_021095c0;
  this_00 = &this->m_test_cases;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::IncompleteTexTest::testCase,_std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::IncompleteTexTest::testCase,_std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::IncompleteTexTest::testCase,_std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_dst_buf_name = 0;
  this->m_dst_tex_name = 0;
  this->m_src_buf_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  lVar4 = 0;
  do {
    local_34.m_tex_target = *(uint *)((long)&s_valid_targets + lVar4);
    local_34.m_is_dst_complete = false;
    local_34.m_is_src_complete = false;
    local_34.m_expected_result = 0x502;
    if ((int)local_34.m_tex_target < 0x9100) {
      if ((local_34.m_tex_target != 0x84f5) && (local_34.m_tex_target != 0x8d41)) {
LAB_008814c2:
        iVar2._M_current =
             (this->m_test_cases).
             super__Vector_base<gl4cts::CopyImage::IncompleteTexTest::testCase,_std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->m_test_cases).
            super__Vector_base<gl4cts::CopyImage::IncompleteTexTest::testCase,_std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<gl4cts::CopyImage::IncompleteTexTest::testCase,std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>>
          ::_M_realloc_insert<gl4cts::CopyImage::IncompleteTexTest::testCase_const&>
                    ((vector<gl4cts::CopyImage::IncompleteTexTest::testCase,std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>>
                      *)this_00,iVar2,&local_34);
        }
        else {
          (iVar2._M_current)->m_expected_result = 0x502;
          uVar3 = (uint6)local_34.m_tex_target;
          (iVar2._M_current)->m_tex_target = (int)uVar3;
          (iVar2._M_current)->m_is_dst_complete = (bool)(char)(uVar3 >> 0x20);
          (iVar2._M_current)->m_is_src_complete = (bool)(char)(uVar3 >> 0x28);
          *(undefined2 *)&(iVar2._M_current)->field_0x6 = local_34._6_2_;
          pptVar1 = &(this->m_test_cases).
                     super__Vector_base<gl4cts::CopyImage::IncompleteTexTest::testCase,_std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pptVar1 = *pptVar1 + 1;
        }
        local_34.m_is_dst_complete = true;
        local_34.m_is_src_complete = false;
        iVar2._M_current =
             (this->m_test_cases).
             super__Vector_base<gl4cts::CopyImage::IncompleteTexTest::testCase,_std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->m_test_cases).
            super__Vector_base<gl4cts::CopyImage::IncompleteTexTest::testCase,_std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<gl4cts::CopyImage::IncompleteTexTest::testCase,std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>>
          ::_M_realloc_insert<gl4cts::CopyImage::IncompleteTexTest::testCase_const&>
                    ((vector<gl4cts::CopyImage::IncompleteTexTest::testCase,std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>>
                      *)this_00,iVar2,&local_34);
        }
        else {
          (iVar2._M_current)->m_expected_result = local_34.m_expected_result;
          (iVar2._M_current)->m_tex_target = local_34.m_tex_target;
          (iVar2._M_current)->m_is_dst_complete = (bool)(char)1;
          (iVar2._M_current)->m_is_src_complete = (bool)(char)(1 >> 8);
          *(undefined2 *)&(iVar2._M_current)->field_0x6 = local_34._6_2_;
          pptVar1 = &(this->m_test_cases).
                     super__Vector_base<gl4cts::CopyImage::IncompleteTexTest::testCase,_std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pptVar1 = *pptVar1 + 1;
        }
        local_34.m_is_dst_complete = false;
        local_34.m_is_src_complete = true;
        iVar2._M_current =
             (this->m_test_cases).
             super__Vector_base<gl4cts::CopyImage::IncompleteTexTest::testCase,_std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->m_test_cases).
            super__Vector_base<gl4cts::CopyImage::IncompleteTexTest::testCase,_std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<gl4cts::CopyImage::IncompleteTexTest::testCase,std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>>
          ::_M_realloc_insert<gl4cts::CopyImage::IncompleteTexTest::testCase_const&>
                    ((vector<gl4cts::CopyImage::IncompleteTexTest::testCase,std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>>
                      *)this_00,iVar2,&local_34);
        }
        else {
          (iVar2._M_current)->m_expected_result = local_34.m_expected_result;
          (iVar2._M_current)->m_tex_target = local_34.m_tex_target;
          (iVar2._M_current)->m_is_dst_complete = (bool)(char)0x100;
          (iVar2._M_current)->m_is_src_complete = (bool)(char)(0x100 >> 8);
          *(undefined2 *)&(iVar2._M_current)->field_0x6 = local_34._6_2_;
          pptVar1 = &(this->m_test_cases).
                     super__Vector_base<gl4cts::CopyImage::IncompleteTexTest::testCase,_std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pptVar1 = *pptVar1 + 1;
        }
        local_34.m_is_dst_complete = true;
        local_34.m_is_src_complete = true;
        local_34.m_expected_result = 0;
        iVar2._M_current =
             (this->m_test_cases).
             super__Vector_base<gl4cts::CopyImage::IncompleteTexTest::testCase,_std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->m_test_cases).
            super__Vector_base<gl4cts::CopyImage::IncompleteTexTest::testCase,_std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<gl4cts::CopyImage::IncompleteTexTest::testCase,std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>>
          ::_M_realloc_insert<gl4cts::CopyImage::IncompleteTexTest::testCase_const&>
                    ((vector<gl4cts::CopyImage::IncompleteTexTest::testCase,std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>>
                      *)this_00,iVar2,&local_34);
        }
        else {
          (iVar2._M_current)->m_expected_result = 0;
          (iVar2._M_current)->m_tex_target = local_34.m_tex_target;
          (iVar2._M_current)->m_is_dst_complete = (bool)(char)0x101;
          (iVar2._M_current)->m_is_src_complete = (bool)(char)(0x101 >> 8);
          *(undefined2 *)&(iVar2._M_current)->field_0x6 = local_34._6_2_;
          pptVar1 = &(this->m_test_cases).
                     super__Vector_base<gl4cts::CopyImage::IncompleteTexTest::testCase,_std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pptVar1 = *pptVar1 + 1;
        }
      }
    }
    else if ((local_34.m_tex_target != 0x9100) && (local_34.m_tex_target != 0x9102))
    goto LAB_008814c2;
    lVar4 = lVar4 + 4;
    if (lVar4 == 0x2c) {
      return;
    }
  } while( true );
}

Assistant:

IncompleteTexTest::IncompleteTexTest(deqp::Context& context)
	: TestCase(
		  context, "incomplete_tex",
		  "Test verifies if INVALID_OPERATION is generated when texture provided to CopySubImageData is incomplete")
	, m_dst_buf_name(0)
	, m_dst_tex_name(0)
	, m_src_buf_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		const GLenum tex_target = s_valid_targets[target];
		testCase	 test_case  = { tex_target, false, false, GL_INVALID_OPERATION };

		/* Skip targets that are not multi level */
		if (false == Utils::isTargetMultilevel(tex_target))
		{
			continue;
		}

		m_test_cases.push_back(test_case);

		test_case.m_is_dst_complete = true;
		test_case.m_is_src_complete = false;
		m_test_cases.push_back(test_case);

		test_case.m_is_dst_complete = false;
		test_case.m_is_src_complete = true;
		m_test_cases.push_back(test_case);

		test_case.m_is_dst_complete = true;
		test_case.m_is_src_complete = true;
		test_case.m_expected_result = GL_NO_ERROR;
		m_test_cases.push_back(test_case);
	}
}